

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall cmGlobalNinjaGenerator::EncodeLiteral(cmGlobalNinjaGenerator *this,string *lit)

{
  string *source;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator<char> local_75 [13];
  string local_68;
  char *local_48;
  char local_39;
  string local_38;
  string *local_18;
  string *lit_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_18 = lit;
  lit_local = (string *)this;
  cmsys::SystemTools::ReplaceString(lit,"$","$$");
  cmsys::SystemTools::ReplaceString(local_18,"\n","$\n");
  uVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])();
  source = local_18;
  if ((uVar1 & 1) != 0) {
    local_39 = '$';
    iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x17])();
    local_48 = (char *)CONCAT44(extraout_var,iVar2);
    cmStrCat<char,char_const*>(&local_38,&local_39,&local_48);
    iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x17])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,(char *)CONCAT44(extraout_var_00,iVar2),local_75);
    cmsys::SystemTools::ReplaceString(source,&local_38,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(local_75);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return local_18;
}

Assistant:

std::string& cmGlobalNinjaGenerator::EncodeLiteral(std::string& lit)
{
  cmSystemTools::ReplaceString(lit, "$", "$$");
  cmSystemTools::ReplaceString(lit, "\n", "$\n");
  if (this->IsMultiConfig()) {
    cmSystemTools::ReplaceString(lit, cmStrCat('$', this->GetCMakeCFGIntDir()),
                                 this->GetCMakeCFGIntDir());
  }
  return lit;
}